

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall t_cpp_generator::init_generator(t_cpp_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  ofstream_with_content_based_conditional_update *poVar1;
  string *psVar2;
  t_program *ptVar3;
  pointer pptVar4;
  pointer pbVar5;
  int iVar6;
  int *piVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  pointer pptVar9;
  t_cpp_generator *ptVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *cpp_include;
  pointer pbVar11;
  string f_types_tcc_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string f_types_impl_name;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_types_name,this);
  iVar6 = mkdir(f_types_name._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&f_types_name);
  if (iVar6 == -1) {
    piVar7 = __errno_location();
    if (*piVar7 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
                (&f_types_tcc_name,this);
      std::__cxx11::string::string
                ((string *)&f_types_impl_name,f_types_tcc_name._M_dataplus._M_p,
                 (allocator *)&local_168);
      std::operator+(&f_types_name,&f_types_impl_name,": ");
      __rhs = strerror(*piVar7);
      std::operator+(__return_storage_ptr__,&f_types_name,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  psVar2 = &(this->super_t_oop_generator).super_t_generator.program_name_;
  ptVar10 = (t_cpp_generator *)psVar2;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar2);
  get_legal_program_name(&f_types_name,ptVar10,&local_50);
  std::__cxx11::string::operator=((string *)psVar2,(string *)&f_types_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&local_50);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&f_types_tcc_name,this)
  ;
  std::operator+(&f_types_impl_name,&f_types_tcc_name,psVar2);
  std::operator+(&f_types_name,&f_types_impl_name,"_types.h");
  std::__cxx11::string::~string((string *)&f_types_impl_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&f_types_name,__oflag);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_168,this);
  std::operator+(&f_types_tcc_name,&local_168,psVar2);
  std::operator+(&f_types_impl_name,&f_types_tcc_name,"_types.cpp");
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string
            ((string *)&f_types_tcc_name,f_types_impl_name._M_dataplus._M_p,(allocator *)&local_168)
  ;
  this_01 = &this->f_types_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_01,(char *)&f_types_tcc_name,__oflag_00);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  if (this->gen_templates_ == true) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_f0,this);
    std::operator+(&local_168,&local_f0,psVar2);
    std::operator+(&f_types_tcc_name,&local_168,"_types.tcc");
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::string
              ((string *)&local_168,f_types_tcc_name._M_dataplus._M_p,(allocator *)&local_f0);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_types_tcc_,(char *)&local_168,__oflag_01);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&f_types_tcc_name);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&f_types_tcc_name,this)
  ;
  std::operator<<((ostream *)this_00,(string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&f_types_tcc_name,this)
  ;
  std::operator<<((ostream *)this_01,(string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&f_types_tcc_name,this)
  ;
  poVar1 = &this->f_types_tcc_;
  std::operator<<((ostream *)poVar1,(string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  poVar8 = std::operator<<((ostream *)this_00,"#ifndef ");
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_TYPES_H");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#define ");
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_TYPES_H");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)poVar1,"#ifndef ");
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_TYPES_TCC");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#define ");
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_TYPES_TCC");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_00,"#include <iosfwd>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#include <thrift/Thrift.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#include <thrift/TApplicationException.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#include <thrift/TBase.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#include <thrift/protocol/TProtocol.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"#include <thrift/transport/TTransport.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_00,"#include <functional>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_00,"#include <memory>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
  pptVar4 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pptVar9 = (ptVar3->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; pptVar9 != pptVar4; pptVar9 = pptVar9 + 1
      ) {
    ptVar3 = *pptVar9;
    poVar8 = std::operator<<((ostream *)this_00,"#include \"");
    get_include_prefix_abi_cxx11_(&f_types_tcc_name,this,ptVar3);
    poVar8 = std::operator<<(poVar8,(string *)&f_types_tcc_name);
    poVar8 = std::operator<<(poVar8,(string *)&ptVar3->name_);
    poVar8 = std::operator<<(poVar8,"_types.h\"");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&f_types_tcc_name);
    poVar8 = std::operator<<((ostream *)poVar1,"#include \"");
    get_include_prefix_abi_cxx11_(&f_types_tcc_name,this,ptVar3);
    poVar8 = std::operator<<(poVar8,(string *)&f_types_tcc_name);
    poVar8 = std::operator<<(poVar8,(string *)&ptVar3->name_);
    poVar8 = std::operator<<(poVar8,"_types.tcc\"");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&f_types_tcc_name);
  }
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  ptVar3 = (this->super_t_oop_generator).super_t_generator.program_;
  pbVar5 = (ptVar3->cpp_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = (ptVar3->cpp_includes_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar5; pbVar11 = pbVar11 + 1
      ) {
    if (*(pbVar11->_M_dataplus)._M_p == '<') {
      poVar8 = std::operator<<((ostream *)this_00,"#include ");
      poVar8 = std::operator<<(poVar8,(string *)pbVar11);
    }
    else {
      poVar8 = std::operator<<((ostream *)this_00,"#include \"");
      poVar8 = std::operator<<(poVar8,(string *)pbVar11);
      poVar8 = std::operator<<(poVar8,"\"");
    }
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_01,"#include \"");
  get_include_prefix_abi_cxx11_
            (&f_types_tcc_name,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar8 = std::operator<<(poVar8,(string *)&f_types_tcc_name);
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_types.h\"");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  poVar8 = std::operator<<((ostream *)poVar1,"#include \"");
  get_include_prefix_abi_cxx11_
            (&f_types_tcc_name,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar8 = std::operator<<(poVar8,(string *)&f_types_tcc_name);
  poVar8 = std::operator<<(poVar8,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,"_types.h\"");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  poVar8 = std::operator<<((ostream *)this_01,"#include <algorithm>");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_01,"#include <ostream>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_01,"#include <thrift/TToString.h>");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  ptVar10 = (t_cpp_generator *)(this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_90,"cpp",(allocator *)&local_168);
  t_program::get_namespace(&local_70,(t_program *)ptVar10,&local_90);
  namespace_open(&f_types_tcc_name,ptVar10,&local_70);
  psVar2 = &this->ns_open_;
  std::__cxx11::string::operator=((string *)psVar2,(string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  ptVar10 = (t_cpp_generator *)(this->super_t_oop_generator).super_t_generator.program_;
  std::__cxx11::string::string((string *)&local_d0,"cpp",(allocator *)&local_168);
  t_program::get_namespace(&local_b0,(t_program *)ptVar10,&local_d0);
  namespace_close(&f_types_tcc_name,ptVar10,&local_b0);
  std::__cxx11::string::operator=((string *)&this->ns_close_,(string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&f_types_tcc_name);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  poVar8 = std::operator<<((ostream *)this_00,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)this_01,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<((ostream *)poVar1,(string *)psVar2);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_types_impl_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  return;
}

Assistant:

void t_cpp_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  program_name_ = get_legal_program_name(program_name_);

  // Make output file
  string f_types_name = get_out_dir() + program_name_ + "_types.h";
  f_types_.open(f_types_name);

  string f_types_impl_name = get_out_dir() + program_name_ + "_types.cpp";
  f_types_impl_.open(f_types_impl_name.c_str());

  if (gen_templates_) {
    // If we don't open the stream, it appears to just discard data,
    // which is fine.
    string f_types_tcc_name = get_out_dir() + program_name_ + "_types.tcc";
    f_types_tcc_.open(f_types_tcc_name.c_str());
  }

  // Print header
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();
  f_types_tcc_ << autogen_comment();

  // Start ifndef
  f_types_ << "#ifndef " << program_name_ << "_TYPES_H" << endl << "#define " << program_name_
           << "_TYPES_H" << endl << endl;
  f_types_tcc_ << "#ifndef " << program_name_ << "_TYPES_TCC" << endl << "#define " << program_name_
               << "_TYPES_TCC" << endl << endl;

  // Include base types
  f_types_ << "#include <iosfwd>" << endl
           << endl
           << "#include <thrift/Thrift.h>" << endl
           << "#include <thrift/TApplicationException.h>" << endl
           << "#include <thrift/TBase.h>" << endl
           << "#include <thrift/protocol/TProtocol.h>" << endl
           << "#include <thrift/transport/TTransport.h>" << endl
           << endl;
  // Include C++xx compatibility header
  f_types_ << "#include <functional>" << endl;
  f_types_ << "#include <memory>" << endl;

  // Include other Thrift includes
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    f_types_ << "#include \"" << get_include_prefix(*include) << include->get_name()
             << "_types.h\"" << endl;

    // XXX(simpkins): If gen_templates_ is enabled, we currently assume all
    // included files were also generated with templates enabled.
    f_types_tcc_ << "#include \"" << get_include_prefix(*include) << include->get_name()
                 << "_types.tcc\"" << endl;
  }
  f_types_ << endl;

  // Include custom headers
  const vector<string>& cpp_includes = program_->get_cpp_includes();
  for (const auto & cpp_include : cpp_includes) {
    if (cpp_include[0] == '<') {
      f_types_ << "#include " << cpp_include << endl;
    } else {
      f_types_ << "#include \"" << cpp_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  // Include the types file
  f_types_impl_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
                << "_types.h\"" << endl << endl;
  f_types_tcc_ << "#include \"" << get_include_prefix(*get_program()) << program_name_
               << "_types.h\"" << endl << endl;

  // The swap() code needs <algorithm> for std::swap()
  f_types_impl_ << "#include <algorithm>" << endl;
  // for operator<<
  f_types_impl_ << "#include <ostream>" << endl << endl;
  f_types_impl_ << "#include <thrift/TToString.h>" << endl << endl;

  // Open namespace
  ns_open_ = namespace_open(program_->get_namespace("cpp"));
  ns_close_ = namespace_close(program_->get_namespace("cpp"));

  f_types_ << ns_open_ << endl << endl;

  f_types_impl_ << ns_open_ << endl << endl;

  f_types_tcc_ << ns_open_ << endl << endl;
}